

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O0

bool MeCab::Dictionary::compile
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  istringstream *piVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  _Ios_Openmode _Var6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  StringBuffer *pSVar10;
  POSIDGenerator *this;
  size_type sVar11;
  const_reference pvVar12;
  long *plVar13;
  DictionaryRewriter *pDVar14;
  DecoderFeatureIndex *pDVar15;
  CharProperty *this_00;
  ContextID *pCVar16;
  size_t sVar17;
  size_t sVar18;
  Lattice *pLVar19;
  undefined8 uVar20;
  long lVar21;
  void *pvVar22;
  reference pvVar23;
  size_type sVar24;
  fpos<__mbstate_t> *this_01;
  int __oflag;
  char *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  char *in_RDI;
  undefined1 auVar25 [16];
  uint magic;
  ofstream bofs;
  char charset [32];
  uint version;
  uint fsize;
  uint tsize;
  uint dsize;
  uint rsize;
  uint lsize;
  uint dummy;
  Token dummy_1;
  size_t i_2;
  string tbuf;
  DoubleArray da;
  size_t i_1;
  vector<int,_std::allocator<int>_> val;
  vector<unsigned_long,_std::allocator<unsigned_long>_> len;
  vector<const_char_*,_std::allocator<const_char_*>_> str;
  string prev;
  size_t idx;
  size_t bsize;
  Token *token;
  string key;
  string rfeature;
  string lfeature;
  string ufeature;
  int pid;
  string feature;
  int cost;
  int rid;
  int lid;
  string w;
  size_t n;
  char *col [8];
  size_t tmplen;
  char *tmpstr;
  size_t num;
  scoped_fixed_array<char,_8192> line;
  istream *is;
  ifstream ifs;
  size_t i;
  istringstream iss;
  Iconv config_iconv;
  Iconv iconv;
  string config_charset;
  int factor;
  string node_format;
  int type;
  bool wakati;
  string to;
  string from;
  string fbuf;
  uint lexsize;
  size_t offset;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  dic;
  string pos_id_file;
  string rewrite_file;
  string right_id_file;
  string left_id_file;
  string matrix_bin_file;
  string matrix_file;
  string dicdir;
  Node node;
  scoped_ptr<MeCab::CharProperty> property;
  scoped_ptr<MeCab::StringBuffer> os;
  scoped_ptr<MeCab::Lattice> lattice;
  scoped_ptr<MeCab::Writer> writer;
  scoped_ptr<MeCab::ContextID> cid;
  scoped_ptr<MeCab::DecoderFeatureIndex> fi;
  scoped_ptr<MeCab::POSIDGenerator> posid;
  scoped_ptr<MeCab::DictionaryRewriter> rewrite;
  Connector matrix;
  undefined7 in_stack_ffffffffffffe7f8;
  char in_stack_ffffffffffffe7ff;
  CharProperty *in_stack_ffffffffffffe800;
  DecoderFeatureIndex *in_stack_ffffffffffffe808;
  DecoderFeatureIndex *in_stack_ffffffffffffe810;
  Connector *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe818;
  CharProperty *in_stack_ffffffffffffe820;
  string *in_stack_ffffffffffffe828;
  Writer *in_stack_ffffffffffffe830;
  char **in_stack_ffffffffffffe838;
  char *in_stack_ffffffffffffe840;
  _func_int_size_t_size_t *in_stack_ffffffffffffe850;
  value_type_conflict2 *in_stack_ffffffffffffe858;
  size_t *in_stack_ffffffffffffe860;
  key_type **in_stack_ffffffffffffe868;
  size_t in_stack_ffffffffffffe870;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
  *in_stack_ffffffffffffe878;
  char *in_stack_ffffffffffffe8a8;
  ContextID *in_stack_ffffffffffffe8b0;
  Param *in_stack_ffffffffffffe8b8;
  char *in_stack_ffffffffffffe8c0;
  Param *in_stack_ffffffffffffe8c8;
  char *in_stack_ffffffffffffe960;
  POSIDGenerator *in_stack_ffffffffffffe968;
  string *in_stack_ffffffffffffe970;
  string *in_stack_ffffffffffffe978;
  string *in_stack_ffffffffffffe980;
  StringBuffer *in_stack_ffffffffffffe988;
  DictionaryRewriter *in_stack_ffffffffffffe990;
  char *in_stack_ffffffffffffe998;
  Lattice *in_stack_ffffffffffffe9a0;
  Writer *in_stack_ffffffffffffe9a8;
  Writer *in_stack_ffffffffffffeaa8;
  DictionaryRewriter *in_stack_ffffffffffffeab0;
  DecoderFeatureIndex *in_stack_ffffffffffffeab8;
  ostream *in_stack_ffffffffffffeac0;
  Connector *in_stack_ffffffffffffeac8;
  ostream *in_stack_ffffffffffffead0;
  undefined8 local_f28;
  undefined8 local_f20;
  Connector *local_f18;
  undefined8 local_f10;
  uint local_f08;
  byte local_f02;
  die local_f01;
  long local_f00 [64];
  undefined1 local_cf9;
  char local_cf8 [36];
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  int local_cc8;
  undefined4 local_cc4;
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  ulong local_ca8;
  string local_ca0 [38];
  byte local_c7a;
  die local_c79;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> local_c78;
  byte local_c18;
  die local_c17;
  byte local_c16;
  die local_c15;
  int local_c14;
  undefined8 local_c10;
  undefined8 local_c08;
  int local_bfc;
  undefined8 local_bf8;
  undefined8 local_bf0;
  ulong local_be8;
  vector<int,_std::allocator<int>_> local_be0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_bc8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_bb0;
  string local_b98 [32];
  size_type local_b78;
  long local_b70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  *local_b60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  *local_b58;
  undefined2 *local_b28;
  string local_b20 [32];
  string local_b00 [38];
  byte local_ada;
  die local_ad9;
  byte local_ad8;
  die local_ad7;
  byte local_ad6;
  die local_ad5;
  undefined4 local_ad4;
  byte local_ace;
  die local_acd;
  byte local_acc;
  die local_acb;
  byte local_aca;
  die local_ac9;
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [34];
  byte local_a66;
  die local_a65;
  byte local_a64;
  die local_a63;
  byte local_a62;
  die local_a61;
  int local_a60;
  allocator local_a59;
  string local_a58 [32];
  int local_a38;
  int local_a34;
  int local_a30;
  allocator local_a29;
  string local_a28 [38];
  byte local_a02;
  die local_a01;
  size_t local_a00;
  char *local_9f8;
  char *local_9d8;
  size_t local_9b0;
  char *local_9a8;
  ulong local_9a0;
  scoped_fixed_array<char,_8192> local_998;
  byte local_97a;
  die local_979;
  istringstream *local_978;
  long local_970 [65];
  ulong local_768;
  allocator local_759;
  string local_758 [32];
  istringstream local_738 [390];
  byte local_5b2;
  die local_5b1;
  Iconv local_5b0;
  byte local_59a;
  die local_599;
  Iconv local_598;
  byte local_584;
  die local_583;
  byte local_582;
  die local_581;
  string local_580 [34];
  byte local_55e;
  die local_55d;
  int local_55c;
  string local_558 [32];
  int local_538;
  byte local_531;
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [36];
  int local_4cc;
  long local_4c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  local_4c0;
  allocator local_4a1;
  string local_4a0 [32];
  string local_480 [39];
  allocator local_459;
  string local_458 [32];
  string local_438 [39];
  allocator local_411;
  string local_410 [32];
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  undefined1 local_2d8 [48];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined2 local_294;
  undefined2 local_292;
  undefined2 local_28c;
  undefined1 local_289;
  scoped_ptr<MeCab::CharProperty> local_268;
  scoped_ptr<MeCab::StringBuffer> local_258;
  scoped_ptr<MeCab::Lattice> local_248;
  scoped_ptr<MeCab::Writer> local_238;
  scoped_ptr<MeCab::ContextID> local_228;
  scoped_ptr<MeCab::DecoderFeatureIndex> local_218;
  scoped_ptr<MeCab::POSIDGenerator> local_208 [2];
  scoped_ptr<MeCab::DictionaryRewriter> local_1e8;
  Connector local_1d8;
  char *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Connector::Connector((Connector *)in_stack_ffffffffffffe820);
  scoped_ptr<MeCab::DictionaryRewriter>::scoped_ptr(&local_1e8,(DictionaryRewriter *)0x0);
  scoped_ptr<MeCab::POSIDGenerator>::scoped_ptr(local_208,(POSIDGenerator *)0x0);
  scoped_ptr<MeCab::DecoderFeatureIndex>::scoped_ptr(&local_218,(DecoderFeatureIndex *)0x0);
  scoped_ptr<MeCab::ContextID>::scoped_ptr(&local_228,(ContextID *)0x0);
  scoped_ptr<MeCab::Writer>::scoped_ptr(&local_238,(Writer *)0x0);
  scoped_ptr<MeCab::Lattice>::scoped_ptr(&local_248,(Lattice *)0x0);
  scoped_ptr<MeCab::StringBuffer>::scoped_ptr(&local_258,(StringBuffer *)0x0);
  scoped_ptr<MeCab::CharProperty>::scoped_ptr(&local_268,(CharProperty *)0x0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"matrix.def",&local_339);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"matrix.bin",&local_381);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"left-id.def",&local_3c9);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"right-id.def",&local_411);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"rewrite.def",&local_459);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"pos-id.def",&local_4a1);
  create_filename(in_stack_ffffffffffffe828,(string *)in_stack_ffffffffffffe820);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            *)0x1d4517);
  local_4c8 = 0;
  local_4cc = 0;
  std::__cxx11::string::string(local_4f0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  local_531 = Param::get<bool>(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
  local_538 = Param::get<int>(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  local_55c = Param::get<int>(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
  local_55e = 0;
  if (local_55c < 1) {
    die::die(&local_55d);
    local_55e = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x110);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"factor > 0");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"cost factor needs to be positive value");
    die::operator&(&local_55d,poVar9);
  }
  if ((local_55e & 1) != 0) {
    die::~die((die *)0x1d4749);
  }
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::string::operator=(local_580,local_510);
  }
  uVar7 = std::__cxx11::string::empty();
  local_582 = 0;
  if ((uVar7 & 1) != 0) {
    die::die(&local_581);
    local_582 = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x118);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"!from.empty()");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"input dictionary charset is empty");
    die::operator&(&local_581,poVar9);
  }
  if ((local_582 & 1) != 0) {
    die::~die((die *)0x1d4c15);
  }
  uVar7 = std::__cxx11::string::empty();
  local_584 = 0;
  if ((uVar7 & 1) != 0) {
    die::die(&local_583);
    local_584 = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x119);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"!to.empty()");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"output dictionary charset is empty");
    die::operator&(&local_583,poVar9);
  }
  if ((local_584 & 1) != 0) {
    die::~die((die *)0x1d4d4b);
  }
  Iconv::Iconv(&local_598);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar4 = std::__cxx11::string::c_str();
  local_59a = 0;
  uVar5 = Iconv::open(&local_598,pcVar8,iVar4);
  if ((uVar5 & 1) == 0) {
    die::die(&local_599);
    local_59a = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x11c);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"iconv.open(from.c_str(), to.c_str())");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"iconv_open() failed with from=");
    poVar9 = std::operator<<(poVar9,local_510);
    poVar9 = std::operator<<(poVar9," to=");
    poVar9 = std::operator<<(poVar9,local_530);
    die::operator&(&local_599,poVar9);
  }
  if ((local_59a & 1) != 0) {
    die::~die((die *)0x1d4f2b);
  }
  Iconv::Iconv(&local_5b0);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar4 = std::__cxx11::string::c_str();
  local_5b2 = 0;
  uVar5 = Iconv::open(&local_5b0,pcVar8,iVar4);
  if ((uVar5 & 1) == 0) {
    die::die(&local_5b1);
    local_5b2 = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x120);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"config_iconv.open(config_charset.c_str(), from.c_str())");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"iconv_open() failed with from=");
    poVar9 = std::operator<<(poVar9,local_580);
    poVar9 = std::operator<<(poVar9," to=");
    poVar9 = std::operator<<(poVar9,local_510);
    die::operator&(&local_5b1,poVar9);
  }
  if ((local_5b2 & 1) != 0) {
    die::~die((die *)0x1d510b);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    operator_new(0x200);
    Writer::Writer(in_stack_ffffffffffffe830);
    scoped_ptr<MeCab::Writer>::reset
              ((scoped_ptr<MeCab::Writer> *)in_stack_ffffffffffffe810,
               (Writer *)in_stack_ffffffffffffe808);
    createLattice();
    scoped_ptr<MeCab::Lattice>::reset
              ((scoped_ptr<MeCab::Lattice> *)in_stack_ffffffffffffe810,
               (Lattice *)in_stack_ffffffffffffe808);
    pSVar10 = (StringBuffer *)operator_new(0x28);
    StringBuffer::StringBuffer(pSVar10);
    scoped_ptr<MeCab::StringBuffer>::reset
              ((scoped_ptr<MeCab::StringBuffer> *)in_stack_ffffffffffffe810,
               (StringBuffer *)in_stack_ffffffffffffe808);
    memset(local_2d8,0,0x70);
  }
  std::__cxx11::string::c_str();
  bVar2 = Connector::openText(in_stack_ffffffffffffeac8,(char *)in_stack_ffffffffffffeac0);
  if (!bVar2) {
    pcVar8 = (char *)std::__cxx11::string::c_str();
    uVar5 = Connector::open(&local_1d8,pcVar8,0x2220ef);
    if ((uVar5 & 1) == 0) {
      Connector::set_left_size(&local_1d8,1);
      Connector::set_right_size(&local_1d8,1);
    }
  }
  operator_new(0x18);
  POSIDGenerator::POSIDGenerator((POSIDGenerator *)0x1d53d1);
  scoped_ptr<MeCab::POSIDGenerator>::reset
            ((scoped_ptr<MeCab::POSIDGenerator> *)in_stack_ffffffffffffe810,
             (POSIDGenerator *)in_stack_ffffffffffffe808);
  this = scoped_ptr<MeCab::POSIDGenerator>::operator->(local_208);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  POSIDGenerator::open(this,pcVar8,(int)&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n",&local_759);
  std::__cxx11::istringstream::istringstream(local_738,local_758,_S_in);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  for (local_768 = 0; uVar7 = local_768,
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_10), uVar7 < sVar11; local_768 = local_768 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,local_768);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_970,pcVar8,_S_in);
    local_978 = (istringstream *)local_970;
    bVar3 = std::ios::operator!((ios *)((long)local_970 + *(long *)(local_970[0] + -0x18)));
    if ((bVar3 & 1) != 0) {
      if (local_538 == 2) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_10,local_768);
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)pvVar12);
        poVar9 = std::operator<<(poVar9," is not found. minimum setting is used.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        local_978 = local_738;
      }
      else {
        local_97a = 0;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)((long)local_970 + *(long *)(local_970[0] + -0x18)));
        if (!bVar2) {
          die::die(&local_979);
          local_97a = 1;
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,"(");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x13e);
          poVar9 = std::operator<<(poVar9,") [");
          poVar9 = std::operator<<(poVar9,"ifs");
          poVar9 = std::operator<<(poVar9,"] ");
          poVar9 = std::operator<<(poVar9,"no such file or directory: ");
          pvVar12 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_10,local_768);
          poVar9 = std::operator<<(poVar9,(string *)pvVar12);
          die::operator&(&local_979,poVar9);
        }
        if ((local_97a & 1) != 0) {
          die::~die((die *)0x1d57c5);
        }
      }
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"reading ");
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_10,local_768);
    poVar9 = std::operator<<(poVar9,(string *)pvVar12);
    std::operator<<(poVar9," ... ");
    scoped_fixed_array<char,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_ffffffffffffe800);
    local_9a0 = 0;
    while( true ) {
      piVar1 = local_978;
      pcVar8 = scoped_fixed_array<char,_8192>::get(&local_998);
      scoped_fixed_array<char,_8192>::size(&local_998);
      plVar13 = (long *)std::istream::getline((char *)piVar1,(long)pcVar8);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar13 + *(long *)(*plVar13 + -0x18)));
      if (!bVar2) break;
      local_9a8 = scoped_fixed_array<char,_8192>::get(&local_998);
      if (((local_9a8 != (char *)0x0) && (local_9b0 = strlen(local_9a8), local_9b0 != 0)) &&
         (local_9a8[local_9b0 - 1] == '\r')) {
        local_9a8[local_9b0 - 1] = '\0';
      }
      scoped_fixed_array<char,_8192>::get(&local_998);
      local_a00 = tokenizeCSV<char**>(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,
                                      (size_t)in_stack_ffffffffffffe830);
      local_a02 = 0;
      if (local_a00 != 5) {
        die::die(&local_a01);
        local_a02 = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x158);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,"n == 5");
        poVar9 = std::operator<<(poVar9,"] ");
        poVar9 = std::operator<<(poVar9,"format error: ");
        pcVar8 = scoped_fixed_array<char,_8192>::get(&local_998);
        poVar9 = std::operator<<(poVar9,pcVar8);
        die::operator&(&local_a01,poVar9);
      }
      if ((local_a02 & 1) != 0) {
        die::~die((die *)0x1d5b67);
      }
      pcVar8 = local_9f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a28,pcVar8,&local_a29);
      std::allocator<char>::~allocator((allocator<char> *)&local_a29);
      local_a30 = anon_unknown_0::toInt
                            ((char *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      local_a34 = anon_unknown_0::toInt
                            ((char *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      local_a38 = anon_unknown_0::toInt
                            ((char *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      pcVar8 = local_9d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a58,pcVar8,&local_a59);
      std::allocator<char>::~allocator((allocator<char> *)&local_a59);
      scoped_ptr<MeCab::POSIDGenerator>::operator->(local_208);
      std::__cxx11::string::c_str();
      local_a60 = POSIDGenerator::id(in_stack_ffffffffffffe968,in_stack_ffffffffffffe960);
      if (local_a38 == 0x7fffffff) {
        local_a62 = 0;
        if (local_538 != 1) {
          die::die(&local_a61);
          local_a62 = 1;
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,"(");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x162);
          poVar9 = std::operator<<(poVar9,") [");
          poVar9 = std::operator<<(poVar9,"type == MECAB_USR_DIC");
          poVar9 = std::operator<<(poVar9,"] ");
          poVar9 = std::operator<<(poVar9,"cost field should not be empty in sys/unk dic.");
          die::operator&(&local_a61,poVar9);
        }
        if ((local_a62 & 1) != 0) {
          die::~die((die *)0x1d5e02);
        }
        pDVar14 = scoped_ptr<MeCab::DictionaryRewriter>::get(&local_1e8);
        if (pDVar14 == (DictionaryRewriter *)0x0) {
          operator_new(0x78);
          DictionaryRewriter::DictionaryRewriter((DictionaryRewriter *)in_stack_ffffffffffffe800);
          scoped_ptr<MeCab::DictionaryRewriter>::reset
                    ((scoped_ptr<MeCab::DictionaryRewriter> *)in_stack_ffffffffffffe810,
                     (DictionaryRewriter *)in_stack_ffffffffffffe808);
          pDVar14 = scoped_ptr<MeCab::DictionaryRewriter>::operator->(&local_1e8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          DictionaryRewriter::open(pDVar14,pcVar8,(int)&local_5b0);
          operator_new(0x378);
          DecoderFeatureIndex::DecoderFeatureIndex(in_stack_ffffffffffffe810);
          scoped_ptr<MeCab::DecoderFeatureIndex>::reset
                    ((scoped_ptr<MeCab::DecoderFeatureIndex> *)in_stack_ffffffffffffe810,
                     in_stack_ffffffffffffe808);
          local_a64 = 0;
          pDVar15 = scoped_ptr<MeCab::DecoderFeatureIndex>::operator->(&local_218);
          uVar5 = (**(pDVar15->super_FeatureIndex)._vptr_FeatureIndex)(pDVar15,local_8);
          if ((uVar5 & 1) == 0) {
            die::die(&local_a63);
            local_a64 = 1;
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,"(");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x168);
            poVar9 = std::operator<<(poVar9,") [");
            poVar9 = std::operator<<(poVar9,"fi->open(param)");
            poVar9 = std::operator<<(poVar9,"] ");
            poVar9 = std::operator<<(poVar9,"cannot open feature index");
            die::operator&(&local_a63,poVar9);
          }
          if ((local_a64 & 1) != 0) {
            die::~die((die *)0x1d6045);
          }
          operator_new(0x1d8);
          CharProperty::CharProperty(in_stack_ffffffffffffe820);
          scoped_ptr<MeCab::CharProperty>::reset
                    ((scoped_ptr<MeCab::CharProperty> *)in_stack_ffffffffffffe810,
                     (CharProperty *)in_stack_ffffffffffffe808);
          local_a66 = 0;
          this_00 = scoped_ptr<MeCab::CharProperty>::operator->(&local_268);
          uVar5 = CharProperty::open(this_00,local_8,__oflag);
          if ((uVar5 & 1) == 0) {
            die::die(&local_a65);
            local_a66 = 1;
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,"(");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x16a);
            poVar9 = std::operator<<(poVar9,") [");
            poVar9 = std::operator<<(poVar9,"property->open(param)");
            poVar9 = std::operator<<(poVar9,"] ");
            die::operator&(&local_a65,poVar9);
          }
          if ((local_a66 & 1) != 0) {
            die::~die((die *)0x1d61c8);
          }
          scoped_ptr<MeCab::CharProperty>::operator->(&local_268);
          std::__cxx11::string::c_str();
          CharProperty::set_charset
                    (in_stack_ffffffffffffe800,
                     (char *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
        }
        scoped_ptr<MeCab::DecoderFeatureIndex>::get(&local_218);
        scoped_ptr<MeCab::DictionaryRewriter>::get(&local_1e8);
        scoped_ptr<MeCab::CharProperty>::get(&local_268);
        local_a38 = anon_unknown_0::calcCost
                              ((string *)in_stack_ffffffffffffead0,
                               (string *)in_stack_ffffffffffffeac8,
                               (int)((ulong)in_stack_ffffffffffffeac0 >> 0x20),
                               in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab0,
                               (CharProperty *)in_stack_ffffffffffffeaa8);
      }
      if (((local_a30 < 0) || (local_a34 < 0)) ||
         ((local_a30 == 0x7fffffff || (local_a34 == 0x7fffffff)))) {
        pDVar14 = scoped_ptr<MeCab::DictionaryRewriter>::get(&local_1e8);
        if (pDVar14 == (DictionaryRewriter *)0x0) {
          operator_new(0x78);
          DictionaryRewriter::DictionaryRewriter((DictionaryRewriter *)in_stack_ffffffffffffe800);
          scoped_ptr<MeCab::DictionaryRewriter>::reset
                    ((scoped_ptr<MeCab::DictionaryRewriter> *)in_stack_ffffffffffffe810,
                     (DictionaryRewriter *)in_stack_ffffffffffffe808);
          pDVar14 = scoped_ptr<MeCab::DictionaryRewriter>::operator->(&local_1e8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          DictionaryRewriter::open(pDVar14,pcVar8,(int)&local_5b0);
        }
        std::__cxx11::string::string(local_a88);
        std::__cxx11::string::string(local_aa8);
        std::__cxx11::string::string(local_ac8);
        local_aca = 0;
        scoped_ptr<MeCab::DictionaryRewriter>::operator->(&local_1e8);
        bVar2 = DictionaryRewriter::rewrite
                          (in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988,
                           in_stack_ffffffffffffe980,in_stack_ffffffffffffe978,
                           in_stack_ffffffffffffe970);
        if (!bVar2) {
          die::die(&local_ac9);
          local_aca = 1;
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,"(");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x178);
          poVar9 = std::operator<<(poVar9,") [");
          poVar9 = std::operator<<(poVar9,
                                   "rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature)");
          poVar9 = std::operator<<(poVar9,"] ");
          poVar9 = std::operator<<(poVar9,"rewrite failed: ");
          poVar9 = std::operator<<(poVar9,local_a58);
          die::operator&(&local_ac9,poVar9);
        }
        if ((local_aca & 1) != 0) {
          die::~die((die *)0x1d66c7);
        }
        pCVar16 = scoped_ptr<MeCab::ContextID>::get(&local_228);
        if (pCVar16 == (ContextID *)0x0) {
          operator_new(0xa0);
          ContextID::ContextID((ContextID *)in_stack_ffffffffffffe800);
          scoped_ptr<MeCab::ContextID>::reset
                    ((scoped_ptr<MeCab::ContextID> *)in_stack_ffffffffffffe810,
                     (ContextID *)in_stack_ffffffffffffe808);
          pCVar16 = scoped_ptr<MeCab::ContextID>::operator->(&local_228);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iVar4 = std::__cxx11::string::c_str();
          ContextID::open(pCVar16,pcVar8,iVar4,&local_5b0);
          local_acc = 0;
          scoped_ptr<MeCab::ContextID>::operator->(&local_228);
          sVar17 = ContextID::left_size((ContextID *)0x1d67af);
          sVar18 = Connector::left_size(&local_1d8);
          if (sVar17 == sVar18) {
            scoped_ptr<MeCab::ContextID>::operator->(&local_228);
            sVar17 = ContextID::right_size((ContextID *)0x1d6809);
            sVar18 = Connector::right_size(&local_1d8);
            if (sVar17 != sVar18) goto LAB_001d6844;
          }
          else {
LAB_001d6844:
            die::die(&local_acb);
            local_acc = 1;
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,"(");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x180);
            poVar9 = std::operator<<(poVar9,") [");
            poVar9 = std::operator<<(poVar9,
                                     "cid->left_size() == matrix.left_size() && cid->right_size() == matrix.right_size()"
                                    );
            poVar9 = std::operator<<(poVar9,"] ");
            poVar9 = std::operator<<(poVar9,"Context ID files(");
            poVar9 = std::operator<<(poVar9,local_3a8);
            poVar9 = std::operator<<(poVar9," or ");
            poVar9 = std::operator<<(poVar9,local_3f0);
            poVar9 = std::operator<<(poVar9," may be broken");
            die::operator&(&local_acb,poVar9);
          }
          if ((local_acc & 1) != 0) {
            die::~die((die *)0x1d69d6);
          }
        }
        scoped_ptr<MeCab::ContextID>::operator->(&local_228);
        std::__cxx11::string::c_str();
        local_a30 = ContextID::lid(in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
        scoped_ptr<MeCab::ContextID>::operator->(&local_228);
        std::__cxx11::string::c_str();
        local_a34 = ContextID::rid(in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
        std::__cxx11::string::~string(local_ac8);
        std::__cxx11::string::~string(local_aa8);
        std::__cxx11::string::~string(local_a88);
      }
      local_ace = 0;
      if (((local_a30 < 0) || (local_a34 < 0)) ||
         (bVar2 = Connector::is_valid(&local_1d8,(long)local_a30,(long)local_a34), !bVar2)) {
        die::die(&local_acd);
        local_ace = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x18b);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)");
        poVar9 = std::operator<<(poVar9,"] ");
        poVar9 = std::operator<<(poVar9,"invalid ids are found lid=");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_a30);
        poVar9 = std::operator<<(poVar9," rid=");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_a34);
        die::operator&(&local_acd,poVar9);
      }
      if ((local_ace & 1) != 0) {
        die::~die((die *)0x1d6d08);
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        bVar2 = Iconv::convert((Iconv *)in_stack_ffffffffffffe808,
                               (string *)in_stack_ffffffffffffe800);
        if (bVar2) {
          if ((local_538 == 2) ||
             (bVar2 = Iconv::convert((Iconv *)in_stack_ffffffffffffe808,
                                     (string *)in_stack_ffffffffffffe800), bVar2)) {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              local_2a8 = std::__cxx11::string::c_str();
              local_2a0 = std::__cxx11::string::c_str();
              local_294 = std::__cxx11::string::size();
              local_292 = std::__cxx11::string::size();
              local_28c = (undefined2)local_a60;
              local_289 = 0;
              pLVar19 = scoped_ptr<MeCab::Lattice>::operator->(&local_248);
              uVar20 = std::__cxx11::string::c_str();
              (*pLVar19->_vptr_Lattice[9])(pLVar19,uVar20);
              local_ad6 = 0;
              pSVar10 = scoped_ptr<MeCab::StringBuffer>::get(&local_258);
              if (pSVar10 == (StringBuffer *)0x0) {
                die::die(&local_ad5);
                local_ad6 = 1;
                poVar9 = std::operator<<((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                        );
                in_stack_ffffffffffffead0 = std::operator<<(poVar9,"(");
                in_stack_ffffffffffffeac8 =
                     (Connector *)std::ostream::operator<<(in_stack_ffffffffffffead0,0x1a7);
                in_stack_ffffffffffffeac0 =
                     std::operator<<((ostream *)in_stack_ffffffffffffeac8,") [");
                in_stack_ffffffffffffeab8 =
                     (DecoderFeatureIndex *)std::operator<<(in_stack_ffffffffffffeac0,"os.get()");
                in_stack_ffffffffffffeab0 =
                     (DictionaryRewriter *)
                     std::operator<<((ostream *)in_stack_ffffffffffffeab8,"] ");
                die::operator&(&local_ad5,(ostream *)in_stack_ffffffffffffeab0);
              }
              if ((local_ad6 & 1) != 0) {
                die::~die((die *)0x1d7065);
              }
              local_ad8 = 0;
              in_stack_ffffffffffffeaa8 = scoped_ptr<MeCab::Writer>::get(&local_238);
              if (in_stack_ffffffffffffeaa8 == (Writer *)0x0) {
                die::die(&local_ad7);
                local_ad8 = 1;
                poVar9 = std::operator<<((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                        );
                poVar9 = std::operator<<(poVar9,"(");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1a8);
                poVar9 = std::operator<<(poVar9,") [");
                poVar9 = std::operator<<(poVar9,"writer.get()");
                poVar9 = std::operator<<(poVar9,"] ");
                die::operator&(&local_ad7,poVar9);
              }
              if ((local_ad8 & 1) != 0) {
                die::~die((die *)0x1d7191);
              }
              pSVar10 = scoped_ptr<MeCab::StringBuffer>::operator->(&local_258);
              StringBuffer::clear(pSVar10);
              local_ada = 0;
              scoped_ptr<MeCab::Writer>::operator->(&local_238);
              scoped_ptr<MeCab::Lattice>::get(&local_248);
              std::__cxx11::string::c_str();
              scoped_ptr<MeCab::StringBuffer>::operator*(&local_258);
              bVar2 = Writer::writeNode(in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                                        in_stack_ffffffffffffe998,(Node *)in_stack_ffffffffffffe990,
                                        in_stack_ffffffffffffe988);
              if (!bVar2) {
                die::die(&local_ad9);
                local_ada = 1;
                poVar9 = std::operator<<((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                        );
                poVar9 = std::operator<<(poVar9,"(");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1ac);
                poVar9 = std::operator<<(poVar9,") [");
                poVar9 = std::operator<<(poVar9,
                                         "writer->writeNode(lattice.get(), node_format.c_str(), &node, &*os)"
                                        );
                poVar9 = std::operator<<(poVar9,"] ");
                poVar9 = std::operator<<(poVar9,"conversion error: ");
                poVar9 = std::operator<<(poVar9,local_a58);
                poVar9 = std::operator<<(poVar9," with ");
                poVar9 = std::operator<<(poVar9,local_558);
                die::operator&(&local_ad9,poVar9);
              }
              if ((local_ada & 1) != 0) {
                die::~die((die *)0x1d73d5);
              }
              scoped_ptr<MeCab::StringBuffer>::operator*(&local_258);
              StringBuffer::operator<<
                        ((StringBuffer *)in_stack_ffffffffffffe800,in_stack_ffffffffffffe7ff);
              pSVar10 = scoped_ptr<MeCab::StringBuffer>::operator->(&local_258);
              pcVar8 = StringBuffer::str(pSVar10);
              std::__cxx11::string::operator=(local_a58,pcVar8);
            }
            std::__cxx11::string::string(local_b00);
            if ((local_531 & 1) == 0) {
              std::operator+(in_stack_ffffffffffffe818,
                             (char)((ulong)in_stack_ffffffffffffe810 >> 0x38));
              std::__cxx11::string::operator=(local_b00,local_b20);
              std::__cxx11::string::~string(local_b20);
            }
            local_b28 = (undefined2 *)operator_new(0x10);
            *local_b28 = (undefined2)local_a30;
            local_b28[1] = (undefined2)local_a34;
            local_b28[2] = (undefined2)local_a60;
            local_b28[3] = (undefined2)local_a38;
            *(undefined4 *)(local_b28 + 4) = (undefined4)local_4c8;
            *(undefined4 *)(local_b28 + 6) = 0;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MeCab::Token_*&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
                        *)in_stack_ffffffffffffe810,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe808,(Token **)in_stack_ffffffffffffe800);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                         *)in_stack_ffffffffffffe800,
                        (value_type *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8))
            ;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
                     *)0x1d7621);
            if ((local_531 & 1) == 0) {
              uVar7 = std::__cxx11::string::data();
              std::__cxx11::string::size();
              std::__cxx11::string::append((char *)local_4f0,uVar7);
            }
            lVar21 = std::__cxx11::string::size();
            local_4c8 = lVar21 + local_4c8;
            local_9a0 = local_9a0 + 1;
            local_4cc = local_4cc + 1;
            std::__cxx11::string::~string(local_b00);
            local_ad4 = 0;
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "iconv conversion failed. skip this entry");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            local_ad4 = 5;
          }
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"iconv conversion failed. skip this entry")
          ;
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          local_ad4 = 5;
        }
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,"empty word is found, discard this line");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        local_ad4 = 5;
      }
      std::__cxx11::string::~string(local_a58);
      std::__cxx11::string::~string(local_a28);
    }
    pvVar22 = (void *)std::ostream::operator<<(&std::cout,local_9a0);
    std::ostream::operator<<(pvVar22,std::endl<char,std::char_traits<char>>);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_ffffffffffffe800);
    std::ifstream::~ifstream(local_970);
  }
  if ((local_531 & 1) != 0) {
    std::__cxx11::string::append((char *)local_4f0,0x2218a0);
  }
  local_b58 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
  local_b60 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>
            (local_b58,local_b60);
  local_b70 = 0;
  local_b78 = 0;
  std::__cxx11::string::string(local_b98);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1d7873);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1d7880);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d788d);
  local_be8 = 0;
  do {
    uVar7 = local_be8;
    sVar11 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
             ::size(&local_4c0);
    if (sVar11 <= uVar7) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::operator[](&local_4c0,local_b78);
      local_c08 = std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe800,
                 (value_type *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::operator[](&local_4c0,local_b78);
      local_c10 = std::__cxx11::string::size();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffe800,
                 (value_type_conflict4 *)
                 CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      local_c14 = (int)local_b70 + (int)local_b78 * 0x100;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe800,
                 (value_type_conflict2 *)
                 CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      sVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_bb0);
      sVar24 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_bc8);
      local_c16 = 0;
      if (sVar11 != sVar24) {
        die::die(&local_c15);
        local_c16 = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1eb);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,"str.size() == len.size()");
        poVar9 = std::operator<<(poVar9,"] ");
        die::operator&(&local_c15,poVar9);
      }
      if ((local_c16 & 1) != 0) {
        die::~die((die *)0x1d7c1f);
      }
      sVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_bb0);
      sVar24 = std::vector<int,_std::allocator<int>_>::size(&local_be0);
      local_c18 = 0;
      if (sVar11 != sVar24) {
        die::die(&local_c17);
        local_c18 = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1ec);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,"str.size() == val.size()");
        poVar9 = std::operator<<(poVar9,"] ");
        die::operator&(&local_c17,poVar9);
      }
      if ((local_c18 & 1) != 0) {
        die::~die((die *)0x1d7d58);
      }
      Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
      DoubleArrayImpl(&local_c78);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_bb0);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_bb0,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_bc8,0);
      std::vector<int,_std::allocator<int>_>::operator[](&local_be0,0);
      local_c7a = 0;
      iVar4 = Darts::
              DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
              build(in_stack_ffffffffffffe878,in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
                    in_stack_ffffffffffffe860,in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      if (iVar4 != 0) {
        die::die(&local_c79);
        local_c7a = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1f0);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,
                                 "da.build(str.size(), const_cast<char **>(&str[0]), &len[0], &val[0], &progress_bar_darts) == 0"
                                );
        poVar9 = std::operator<<(poVar9,"] ");
        poVar9 = std::operator<<(poVar9,"unkown error in building double-array");
        die::operator&(&local_c79,poVar9);
      }
      if ((local_c7a & 1) != 0) {
        die::~die((die *)0x1d7f40);
      }
      std::__cxx11::string::string(local_ca0);
      for (local_ca8 = 0; uVar7 = local_ca8,
          sVar11 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                   ::size(&local_4c0), uVar7 < sVar11; local_ca8 = local_ca8 + 1) {
        pvVar23 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                  ::operator[](&local_4c0,local_ca8);
        std::__cxx11::string::append((char *)local_ca0,(ulong)pvVar23->second);
        pvVar23 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                  ::operator[](&local_4c0,local_ca8);
        if (pvVar23->second != (Token *)0x0) {
          operator_delete(pvVar23->second);
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
               *)0x1d80db);
      while (uVar7 = std::__cxx11::string::size(), (uVar7 & 7) != 0) {
        local_cb8 = 0;
        uStack_cb0 = 0;
        std::__cxx11::string::append((char *)local_ca0,(ulong)&local_cb8);
      }
      local_cbc = 0;
      sVar17 = Connector::left_size(&local_1d8);
      local_cc0 = (undefined4)sVar17;
      sVar17 = Connector::right_size(&local_1d8);
      local_cc4 = (undefined4)sVar17;
      sVar17 = Darts::
               DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
               ::unit_size(&local_c78);
      iVar4 = (int)sVar17;
      sVar17 = Darts::
               DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
               ::size(&local_c78);
      local_cc8 = iVar4 * (int)sVar17;
      local_ccc = std::__cxx11::string::size();
      local_cd0 = std::__cxx11::string::size();
      local_cd4 = 0x66;
      local_cf9 = 0;
      std::fill<char*,char>
                ((char *)in_stack_ffffffffffffe800,
                 (char *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8),
                 (char *)0x1d8212);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      strncpy(local_cf8,pcVar8,0x1f);
      pcVar8 = local_18;
      _Var6 = std::operator|(_S_bin,_S_out);
      std::ofstream::ofstream(local_f00,pcVar8,_Var6);
      local_f02 = 0;
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)local_f00 + *(long *)(local_f00[0] + -0x18)));
      if (!bVar2) {
        die::die(&local_f01);
        local_f02 = 1;
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x20f);
        poVar9 = std::operator<<(poVar9,") [");
        poVar9 = std::operator<<(poVar9,"bofs");
        poVar9 = std::operator<<(poVar9,"] ");
        poVar9 = std::operator<<(poVar9,"permission denied: ");
        poVar9 = std::operator<<(poVar9,local_18);
        die::operator&(&local_f01,poVar9);
      }
      if ((local_f02 & 1) != 0) {
        die::~die((die *)0x1d83d1);
      }
      local_f08 = 0;
      std::ostream::write((char *)local_f00,(long)&local_f08);
      std::ostream::write((char *)local_f00,(long)&local_cd4);
      std::ostream::write((char *)local_f00,(long)&local_538);
      std::ostream::write((char *)local_f00,(long)&local_4cc);
      std::ostream::write((char *)local_f00,(long)&local_cc0);
      std::ostream::write((char *)local_f00,(long)&local_cc4);
      std::ostream::write((char *)local_f00,(long)&local_cc8);
      std::ostream::write((char *)local_f00,(long)&local_ccc);
      std::ostream::write((char *)local_f00,(long)&local_cd0);
      std::ostream::write((char *)local_f00,(long)&local_cbc);
      std::ostream::write((char *)local_f00,(long)local_cf8);
      pvVar22 = Darts::
                DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                ::array(&local_c78);
      Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
      unit_size(&local_c78);
      Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
      size(&local_c78);
      std::ostream::write((char *)local_f00,(long)pvVar22);
      lVar21 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::ostream::write((char *)local_f00,lVar21);
      lVar21 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::ostream::write((char *)local_f00,lVar21);
      auVar25 = std::ostream::tellp();
      local_f10 = auVar25._8_8_;
      this_02 = auVar25._0_8_;
      local_f18 = this_02;
      this_01 = (fpos<__mbstate_t> *)std::fpos::operator_cast_to_long((fpos *)&local_f18);
      local_f08 = (uint)this_01 ^ 0xef718f77;
      std::fpos<__mbstate_t>::fpos
                (this_01,CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      std::ostream::seekp(local_f00,local_f28,local_f20);
      std::ostream::write((char *)local_f00,(long)&local_f08);
      std::ofstream::close();
      local_ad4 = 1;
      std::ofstream::~ofstream(local_f00);
      std::__cxx11::string::~string(local_ca0);
      Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
      ~DoubleArrayImpl((DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                        *)0x1d86d3);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_02);
      std::__cxx11::string::~string(local_b98);
      std::__cxx11::istringstream::~istringstream(local_738);
      Iconv::~Iconv(&local_5b0);
      Iconv::~Iconv(&local_598);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_558);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string(local_4f0);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                 *)this_02);
      std::__cxx11::string::~string(local_480);
      std::__cxx11::string::~string(local_438);
      std::__cxx11::string::~string(local_3f0);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_2f8);
      scoped_ptr<MeCab::CharProperty>::~scoped_ptr((scoped_ptr<MeCab::CharProperty> *)this_01);
      scoped_ptr<MeCab::StringBuffer>::~scoped_ptr((scoped_ptr<MeCab::StringBuffer> *)this_01);
      scoped_ptr<MeCab::Lattice>::~scoped_ptr((scoped_ptr<MeCab::Lattice> *)this_01);
      scoped_ptr<MeCab::Writer>::~scoped_ptr((scoped_ptr<MeCab::Writer> *)this_01);
      scoped_ptr<MeCab::ContextID>::~scoped_ptr((scoped_ptr<MeCab::ContextID> *)this_01);
      scoped_ptr<MeCab::DecoderFeatureIndex>::~scoped_ptr
                ((scoped_ptr<MeCab::DecoderFeatureIndex> *)this_01);
      scoped_ptr<MeCab::POSIDGenerator>::~scoped_ptr((scoped_ptr<MeCab::POSIDGenerator> *)this_01);
      scoped_ptr<MeCab::DictionaryRewriter>::~scoped_ptr
                ((scoped_ptr<MeCab::DictionaryRewriter> *)this_01);
      Connector::~Connector(this_02);
      return true;
    }
    if (local_be8 == 0) {
LAB_001d79e7:
      local_b70 = local_b70 + 1;
    }
    else {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::operator[](&local_4c0,local_be8);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe800,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      if (!bVar2) goto LAB_001d79e7;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::operator[](&local_4c0,local_b78);
      local_bf0 = std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe800,
                 (value_type *)CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::operator[](&local_4c0,local_b78);
      local_bf8 = std::__cxx11::string::size();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffe800,
                 (value_type_conflict4 *)
                 CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      local_bfc = (int)local_b70 + (int)local_b78 * 0x100;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe800,
                 (value_type_conflict2 *)
                 CONCAT17(in_stack_ffffffffffffe7ff,in_stack_ffffffffffffe7f8));
      local_b70 = 1;
      local_b78 = local_be8;
    }
    pvVar23 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ::operator[](&local_4c0,local_be8);
    std::__cxx11::string::operator=(local_b98,(string *)pvVar23);
    local_be8 = local_be8 + 1;
  } while( true );
}

Assistant:

bool Dictionary::compile(const Param &param,
                         const std::vector<std::string> &dics,
                         const char *output) {
  Connector matrix;
  scoped_ptr<DictionaryRewriter> rewrite;
  scoped_ptr<POSIDGenerator> posid;
  scoped_ptr<DecoderFeatureIndex> fi;
  scoped_ptr<ContextID> cid;
  scoped_ptr<Writer> writer;
  scoped_ptr<Lattice> lattice;
  scoped_ptr<StringBuffer> os;
  scoped_ptr<CharProperty> property;
  Node node;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);
  const std::string pos_id_file     = DCONF(POS_ID_FILE);

  std::vector<std::pair<std::string, Token*> > dic;

  size_t offset  = 0;
  unsigned int lexsize = 0;
  std::string fbuf;

  const std::string from = param.get<std::string>("dictionary-charset");
  const std::string to = param.get<std::string>("charset");
  const bool wakati = param.get<bool>("wakati");
  const int type = param.get<int>("type");
  const std::string node_format = param.get<std::string>("node-format");
  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  // for backward compatibility
  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";
  CHECK_DIE(!to.empty())   << "output dictionary charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
      << "iconv_open() failed with from=" << from << " to=" << to;

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  if (!node_format.empty()) {
    writer.reset(new Writer);
    lattice.reset(createLattice());
    os.reset(new StringBuffer);
    memset(&node, 0, sizeof(node));
  }

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  posid.reset(new POSIDGenerator);
  posid->open(pos_id_file.c_str(), &config_iconv);

  std::istringstream iss(UNK_DEF_DEFAULT);

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    std::istream *is = &ifs;
    if (!ifs) {
      if (type == MECAB_UNK_DIC) {
        std::cerr << dics[i]
                  << " is not found. minimum setting is used." << std::endl;
        is = &iss;
      } else {
        CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
      }
    }

    std::cout << "reading " << dics[i] << " ... ";

    scoped_fixed_array<char, BUF_SIZE> line;
    size_t num = 0;

    while (is->getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
        /* if there is CR code, it should be removed */
        char *tmpstr = line.get();
        if(tmpstr != NULL){
          size_t tmplen = strlen(tmpstr);
          if(tmplen > 0){
            if(tmpstr[tmplen-1] == '\r'){
              tmpstr[tmplen-1] = '\0';
            }
          }
        }
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();

      std::string w = col[0];
      int lid = toInt(col[1]);
      int rid = toInt(col[2]);
      int cost = toInt(col[3]);
      std::string feature = col[4];
      const int pid = posid->id(feature.c_str());

      if (cost == INT_MAX) {
        CHECK_DIE(type == MECAB_USR_DIC)
            << "cost field should not be empty in sys/unk dic.";
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
          fi.reset(new DecoderFeatureIndex);
          CHECK_DIE(fi->open(param)) << "cannot open feature index";
          property.reset(new CharProperty);
          CHECK_DIE(property->open(param));
          property->set_charset(from.c_str());
        }
        cost = calcCost(w, feature, factor,
                        fi.get(), rewrite.get(), property.get());
      }

      if (lid < 0  || rid < 0 || lid == INT_MAX || rid == INT_MAX) {
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
        }

        std::string ufeature, lfeature, rfeature;
        CHECK_DIE(rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature))
            << "rewrite failed: " << feature;

        if (!cid.get()) {
          cid.reset(new ContextID);
          cid->open(left_id_file.c_str(),
                    right_id_file.c_str(), &config_iconv);
          CHECK_DIE(cid->left_size()  == matrix.left_size() &&
                    cid->right_size() == matrix.right_size())
              << "Context ID files("
              << left_id_file
              << " or "
              << right_id_file << " may be broken";
        }

        lid = cid->lid(lfeature.c_str());
        rid = cid->rid(rfeature.c_str());
      }

      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;

      if (w.empty()) {
        std::cerr << "empty word is found, discard this line" << std::endl;
        continue;
      }

      if (!iconv.convert(&feature)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (type != MECAB_UNK_DIC && !iconv.convert(&w)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (!node_format.empty()) {
        node.surface = w.c_str();
        node.feature = feature.c_str();
        node.length  = w.size();
        node.rlength = w.size();
        node.posid   = pid;
        node.stat    = MECAB_NOR_NODE;
        lattice->set_sentence(w.c_str());
        CHECK_DIE(os.get());
        CHECK_DIE(writer.get());
        os->clear();
        CHECK_DIE(writer->writeNode(lattice.get(),
                                    node_format.c_str(),
                                    &node, &*os)) <<
            "conversion error: " << feature << " with " << node_format;
        *os << '\0';
        feature = os->str();
      }

      std::string key;
      if (!wakati) {
        key = feature + '\0';
      }

      Token* token  = new Token;
      token->lcAttr = lid;
      token->rcAttr = rid;
      token->posid  = pid;
      token->wcost = cost;
      token->feature = offset;
      token->compound = 0;
      dic.push_back(std::pair<std::string, Token*>(w, token));

      // append to output buffer
      if (!wakati) {
        fbuf.append(key.data(), key.size());
      }
      offset += key.size();

      ++num;
      ++lexsize;
    }

    std::cout << num << std::endl;
  }

  if (wakati) {
    fbuf.append("\0", 1);
  }

  std::stable_sort(dic.begin(), dic.end(),
                   pair_1st_cmp<std::string, Token *>());

  size_t bsize = 0;
  size_t idx = 0;
  std::string prev;
  std::vector<const char *> str;
  std::vector<size_t> len;
  std::vector<Darts::DoubleArray::result_type> val;

  for (size_t i = 0; i < dic.size(); ++i) {
    if (i != 0 && prev != dic[i].first) {
      str.push_back(dic[idx].first.c_str());
      len.push_back(dic[idx].first.size());
      val.push_back(bsize +(idx << 8));
      bsize = 1;
      idx = i;
    } else {
      ++bsize;
    }
    prev = dic[i].first;
  }
  str.push_back(dic[idx].first.c_str());
  len.push_back(dic[idx].first.size());
  val.push_back(bsize +(idx << 8));

  CHECK_DIE(str.size() == len.size());
  CHECK_DIE(str.size() == val.size());

  Darts::DoubleArray da;
  CHECK_DIE(da.build(str.size(), const_cast<char **>(&str[0]),
                     &len[0], &val[0], &progress_bar_darts) == 0)
      << "unkown error in building double-array";

  std::string tbuf;
  for (size_t i = 0; i < dic.size(); ++i) {
    tbuf.append(reinterpret_cast<const char*>(dic[i].second),
                sizeof(Token));
    delete dic[i].second;
  }
  dic.clear();

  // needs to be 8byte(64bit) aligned
  while (tbuf.size() % 8 != 0) {
    Token dummy;
    memset(&dummy, 0, sizeof(Token));
    tbuf.append(reinterpret_cast<const char*>(&dummy), sizeof(Token));
  }

  unsigned int dummy = 0;
  unsigned int lsize = matrix.left_size();
  unsigned int rsize = matrix.right_size();
  unsigned int dsize = da.unit_size() * da.size();
  unsigned int tsize = tbuf.size();
  unsigned int fsize = fbuf.size();

  unsigned int version = DIC_VERSION;
  char charset[32];
  std::fill(charset, charset + sizeof(charset), '\0');
  std::strncpy(charset, to.c_str(), 31);

  std::ofstream bofs(WPATH(output), std::ios::binary|std::ios::out);
  CHECK_DIE(bofs) << "permission denied: " << output;

  unsigned int magic = 0;

  // needs to be 64bit aligned
  // 10*32 = 64*5
  bofs.write(reinterpret_cast<const char *>(&magic),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&version), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&type),    sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lexsize), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&rsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&tsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&fsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dummy),   sizeof(unsigned int));

  // 32 * 8 = 64 * 4
  bofs.write(reinterpret_cast<const char *>(charset),  sizeof(charset));

  bofs.write(reinterpret_cast<const char*>(da.array()),
             da.unit_size() * da.size());
  bofs.write(const_cast<const char *>(tbuf.data()), tbuf.size());
  bofs.write(const_cast<const char *>(fbuf.data()), fbuf.size());

  // save magic id
  magic = static_cast<unsigned int>(bofs.tellp());
  magic ^= DictionaryMagicID;
  bofs.seekp(0);
  bofs.write(reinterpret_cast<const char *>(&magic), sizeof(unsigned int));

  bofs.close();

  return true;
}